

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ushort uVar11;
  ushort auStack_a8 [24];
  U16 symbolNext [53];
  
  uVar5 = 1;
  bVar2 = (byte)tableLog;
  uVar8 = 1 << (bVar2 & 0x1f);
  uVar4 = maxSymbolValue + 1;
  if (uVar4 == 0) {
    dt->nextState = 1;
    dt->nbAdditionalBits = '\0';
    dt->nbBits = '\0';
    dt->baseValue = tableLog;
  }
  else {
    uVar7 = (ulong)(uVar8 - 1);
    uVar10 = 0;
    do {
      uVar11 = normalizedCounter[uVar10];
      if ((short)uVar11 == -1) {
        dt[uVar7 + 1].baseValue = (U32)uVar10;
        uVar11 = 1;
        uVar7 = (ulong)((int)uVar7 - 1);
      }
      else if ((0x10000 << (bVar2 - 1 & 0x1f)) >> 0x10 <= (int)(short)uVar11) {
        uVar5 = 0;
      }
      auStack_a8[uVar10] = uVar11;
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
    dt->nextState = (short)uVar5;
    dt->nbAdditionalBits = (char)((uint)uVar5 >> 0x10);
    dt->nbBits = (char)((uint)uVar5 >> 0x18);
    dt->baseValue = tableLog;
    if (uVar4 != 0) {
      uVar10 = 0;
      uVar6 = 0;
      do {
        sVar1 = normalizedCounter[uVar10];
        if (0 < sVar1) {
          iVar9 = 0;
          do {
            dt[(ulong)uVar6 + 1].baseValue = (U32)uVar10;
            do {
              uVar6 = uVar6 + (uVar8 >> 3) + (uVar8 >> 1) + 3 & uVar8 - 1;
            } while ((uint)uVar7 < uVar6);
            iVar9 = iVar9 + 1;
          } while (iVar9 != sVar1);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar4);
    }
  }
  uVar7 = 0;
  do {
    uVar4 = dt[uVar7 + 1].baseValue;
    uVar11 = auStack_a8[uVar4];
    auStack_a8[uVar4] = uVar11 + 1;
    iVar9 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    bVar3 = bVar2 - (char)iVar9;
    dt[uVar7 + 1].nbBits = bVar3;
    dt[uVar7 + 1].nextState = (uVar11 << (bVar3 & 0x1f)) - (short)uVar8;
    dt[uVar7 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar4];
    dt[uVar7 + 1].baseValue = baseValue[uVar4];
    uVar7 = uVar7 + 1;
  } while (uVar8 != uVar7);
  return;
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}